

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O0

wchar_t close_and_restore_time(wchar_t fd,tree *t,restore_time *rt)

{
  int iVar1;
  wchar_t __fd;
  undefined8 *in_RDX;
  tree *in_RSI;
  int in_EDI;
  timeval times [2];
  timespec timespecs [2];
  timeval local_58;
  undefined8 local_48;
  long local_40;
  timespec local_38;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 *local_18;
  tree *local_10;
  int local_8;
  wchar_t local_4;
  
  if (((in_RSI->flags & 0x80U) == 0) || (*(int *)((long)in_RDX + 0x2c) != 0)) {
    if (in_EDI < 0) {
      local_4 = L'\0';
    }
    else {
      local_4 = close(in_EDI);
    }
  }
  else {
    local_28 = in_RDX[1];
    local_20 = in_RDX[2];
    local_38.tv_sec = in_RDX[3];
    local_38.tv_nsec = in_RDX[4];
    local_18 = in_RDX;
    local_10 = in_RSI;
    local_8 = in_EDI;
    iVar1 = futimens(in_EDI,&local_38);
    if (iVar1 == 0) {
      local_4 = close(local_8);
    }
    else {
      local_48 = local_18[1];
      local_40 = (long)local_18[2] / 1000;
      local_58.tv_sec = local_18[3];
      local_58.tv_usec = (long)local_18[4] / 1000;
      close(local_8);
      __fd = tree_current_dir_fd(local_10);
      iVar1 = futimesat(__fd,(char *)*local_18,&local_58);
      if (iVar1 == 0) {
        local_4 = L'\0';
      }
      else {
        iVar1 = lutimes((char *)*local_18,&local_58);
        if (iVar1 == 0) {
          local_4 = L'\0';
        }
        else {
          local_4 = L'\xffffffff';
        }
      }
    }
  }
  return local_4;
}

Assistant:

static int
close_and_restore_time(int fd, struct tree *t, struct restore_time *rt)
{
#ifndef HAVE_UTIMES
	(void)t; /* UNUSED */
	(void)rt; /* UNUSED */
	return (close(fd));
#else
#if defined(HAVE_FUTIMENS) && !defined(__CYGWIN__)
	struct timespec timespecs[2];
#endif
	struct timeval times[2];

	if ((t->flags & needsRestoreTimes) == 0 || rt->noatime) {
		if (fd >= 0)
			return (close(fd));
		else
			return (0);
	}

#if defined(HAVE_FUTIMENS) && !defined(__CYGWIN__)
	timespecs[1].tv_sec = rt->mtime;
	timespecs[1].tv_nsec = rt->mtime_nsec;

	timespecs[0].tv_sec = rt->atime;
	timespecs[0].tv_nsec = rt->atime_nsec;
	/* futimens() is defined in POSIX.1-2008. */
	if (futimens(fd, timespecs) == 0)
		return (close(fd));
#endif

	times[1].tv_sec = rt->mtime;
	times[1].tv_usec = rt->mtime_nsec / 1000;

	times[0].tv_sec = rt->atime;
	times[0].tv_usec = rt->atime_nsec / 1000;

#if !defined(HAVE_FUTIMENS) && defined(HAVE_FUTIMES) && !defined(__CYGWIN__)
	if (futimes(fd, times) == 0)
		return (close(fd));
#endif
	close(fd);
#if defined(HAVE_FUTIMESAT)
	if (futimesat(tree_current_dir_fd(t), rt->name, times) == 0)
		return (0);
#endif
#ifdef HAVE_LUTIMES
	if (lutimes(rt->name, times) != 0)
#else
	if (AE_IFLNK != rt->filetype && utimes(rt->name, times) != 0)
#endif
		return (-1);
#endif
	return (0);
}